

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_strlike(char *zPattern,char *zStr,uint esc)

{
  int iVar1;
  
  if (zStr == (char *)0x0) {
    return (int)(zPattern != (char *)0x0);
  }
  if (zPattern != (char *)0x0) {
    iVar1 = patternCompare((u8 *)zPattern,(u8 *)zStr,&likeInfoNorm,esc);
    return iVar1;
  }
  return 1;
}

Assistant:

SQLITE_API int sqlite3_strlike(const char *zPattern, const char *zStr, unsigned int esc){
  if( zStr==0 ){
    return zPattern!=0;
  }else if( zPattern==0 ){
    return 1;
  }else{
    return patternCompare((u8*)zPattern, (u8*)zStr, &likeInfoNorm, esc);
  }
}